

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.h
# Opt level: O2

int encode_head(char *data,int len,int value)

{
  uint uVar1;
  byte bVar2;
  ulong uVar3;
  
  uVar1 = head_size(value);
  if (len < (int)uVar1 || (int)uVar1 < 1) {
    uVar1 = 0xffffffff;
  }
  else {
    if (uVar1 == 1) {
      uVar1 = 1;
    }
    else {
      bVar2 = 0x80;
      uVar3 = (ulong)uVar1;
      while (uVar3 != 0) {
        data[uVar3 - 1] = (byte)value & 0x3f | 0x80;
        bVar2 = bVar2 | bVar2 >> 1;
        value = value >> 6;
        uVar3 = uVar3 - 1;
      }
      value = (int)(byte)(bVar2 * '\x02' | *data);
    }
    *data = (char)value;
  }
  return uVar1;
}

Assistant:

inline int encode_head(char* data, int len, int value)
{
    int count = head_size(value);
    if (count <= 0 || len < count)
        return -1;

    if (count == 1) {
        data[0] = (char)value;
        return count;
    }

    unsigned char c = 0x80;
    for (int idx = 0; idx < count; idx++) {
        data[count - idx - 1] = (value & 0x3F) | 0x80;
        c |= (c >> 1);
        value >>= 6;
    }
    data[0] |= (c << 1);
    return count;
}